

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTest.cxx
# Opt level: O0

string * __thiscall
cmCTest::GetScheduleType_abi_cxx11_(string *__return_storage_ptr__,cmCTest *this)

{
  pointer pPVar1;
  cmCTest *this_local;
  
  pPVar1 = std::unique_ptr<cmCTest::Private,_std::default_delete<cmCTest::Private>_>::operator->
                     (&this->Impl);
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)&pPVar1->ScheduleType);
  return __return_storage_ptr__;
}

Assistant:

std::string cmCTest::GetScheduleType() const
{
  return this->Impl->ScheduleType;
}